

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_repeated_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::RepeatedMessageFieldGenerator::WriteToString
          (RepeatedMessageFieldGenerator *this,Printer *printer)

{
  Printer *this_00;
  MappedReference<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char>,_std::__cxx11::basic_string<char>_>_>
  this_01;
  FieldDescriptor *in_RDX;
  string_view local_58 [2];
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  RepeatedMessageFieldGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  GetFieldName_abi_cxx11_(&local_38,(csharp *)(this->super_FieldGeneratorBase).descriptor_,in_RDX);
  this_01 = absl::lts_20240722::container_internal::
            raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
            ::
            operator[]<char[11],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                      ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                        *)&(this->super_FieldGeneratorBase).variables_,(key_arg<char[11]> *)0x65f7b4
                      );
  std::__cxx11::string::operator=((string *)this_01,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  this_00 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_58,"PrintField(\"$field_name$\", $name$_, writer);\n");
  io::Printer::
  Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (this_00,&(this->super_FieldGeneratorBase).variables_,local_58[0]);
  return;
}

Assistant:

void RepeatedMessageFieldGenerator::WriteToString(io::Printer* printer) {
  variables_["field_name"] = GetFieldName(descriptor_);
  printer->Print(
    variables_,
    "PrintField(\"$field_name$\", $name$_, writer);\n");
}